

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es2fBufferWriteTests.cpp
# Opt level: O1

void __thiscall
deqp::gles2::Functional::RandomBufferWriteCase::~RandomBufferWriteCase(RandomBufferWriteCase *this)

{
  ~RandomBufferWriteCase(this);
  operator_delete(this,0x110);
  return;
}

Assistant:

~RandomBufferWriteCase (void)
	{
		delete m_verifier;
	}